

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int read_line_alloc(void *in,DataSourceType in_type,SXML_CHAR **line,int *sz_line,int i0,
                   SXML_CHAR from,SXML_CHAR to,int keep_fromto,SXML_CHAR interest,
                   int *interest_count)

{
  char cVar1;
  int iVar2;
  int iVar3;
  SXML_CHAR *pSVar4;
  char cVar5;
  code *pcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  code *pcVar10;
  bool bVar11;
  
  pcVar10 = fgetc;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar10 = _bgetc;
  }
  pcVar6 = feof;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar6 = _beob;
  }
  uVar8 = 0;
  if (line == (SXML_CHAR **)0x0 || in == (void *)0x0) goto LAB_00105f61;
  cVar5 = '\n';
  if (to != '\0') {
    cVar5 = to;
  }
  if (interest_count != (int *)0x0) {
    *interest_count = 0;
  }
  while( true ) {
    iVar2 = (*pcVar10)(in);
    cVar1 = (char)iVar2;
    if (iVar2 == -1) break;
    if ((interest_count != (int *)0x0) && (cVar1 == interest)) {
      *interest_count = *interest_count + 1;
    }
    if ((from == '\0') || (cVar1 == from)) break;
  }
  if (*line == (SXML_CHAR *)0x0) {
LAB_00105d96:
    if (sz_line == (int *)0x0) {
      bVar11 = false;
    }
    else {
      bVar11 = *sz_line != 0;
    }
LAB_00105da7:
    if (sz_line == (int *)0x0 || bVar11 != false) {
      iVar9 = (uint)(bVar11 ^ 1) << 8;
    }
    else {
      *sz_line = 0x100;
      iVar9 = 0;
    }
    iVar3 = iVar9;
    if (sz_line != (int *)0x0) {
      iVar3 = *sz_line;
    }
    pSVar4 = (SXML_CHAR *)malloc((long)iVar3);
    *line = pSVar4;
    if (pSVar4 == (SXML_CHAR *)0x0) goto LAB_00105f61;
  }
  else {
    iVar9 = 0;
    bVar11 = false;
    if (sz_line == (int *)0x0) goto LAB_00105da7;
    if (*sz_line == 0) goto LAB_00105d96;
  }
  uVar8 = (ulong)(uint)i0;
  if (i0 < 1) {
    uVar8 = 0;
  }
  iVar3 = iVar9;
  if (sz_line != (int *)0x0) {
    iVar3 = *sz_line;
  }
  if ((int)uVar8 < iVar3) {
    if (iVar2 == -1) {
LAB_00105f4a:
      (*line)[uVar8 & 0xffffffff] = '\0';
      iVar2 = (*pcVar6)(in);
      uVar8 = uVar8 & 0xffffffff;
      if (iVar2 == 0) {
        uVar8 = 0;
      }
      goto LAB_00105f61;
    }
    if ((keep_fromto != 0) || (cVar1 != from)) {
      uVar7 = (int)uVar8 + 1;
      (*line)[uVar8] = cVar1;
      iVar2 = iVar9;
      if (sz_line != (int *)0x0) {
        iVar2 = *sz_line;
      }
      uVar8 = (ulong)uVar7;
      if (iVar2 <= (int)uVar7) {
        iVar2 = iVar2 + 0x100;
        iVar3 = iVar2;
        if (sz_line != (int *)0x0) {
          *sz_line = iVar2;
          iVar3 = iVar9;
        }
        pSVar4 = (SXML_CHAR *)realloc(*line,(long)iVar2);
        if (pSVar4 == (SXML_CHAR *)0x0) goto LAB_00105f40;
        *line = pSVar4;
        iVar9 = iVar3;
      }
    }
    (*line)[uVar8] = '\0';
    do {
      iVar2 = (*pcVar10)(in);
      if (iVar2 == -1) goto LAB_00105f4a;
      cVar1 = (char)iVar2;
      if ((interest_count != (int *)0x0) && (cVar1 == interest)) {
        *interest_count = *interest_count + 1;
      }
      (*line)[uVar8 & 0xffffffff] = cVar1;
      iVar2 = iVar9;
      if (sz_line != (int *)0x0) {
        iVar2 = *sz_line;
      }
      uVar8 = (uVar8 & 0xffffffff) + (ulong)(cVar1 != cVar5 || keep_fromto != 0);
      if (iVar2 <= (int)uVar8) {
        iVar2 = iVar2 + 0x100;
        iVar3 = iVar2;
        if (sz_line != (int *)0x0) {
          *sz_line = iVar2;
          iVar3 = iVar9;
        }
        pSVar4 = (SXML_CHAR *)realloc(*line,(long)iVar2);
        if (pSVar4 == (SXML_CHAR *)0x0) goto LAB_00105f40;
        *line = pSVar4;
        iVar9 = iVar3;
      }
      (*line)[uVar8] = '\0';
    } while (cVar1 != cVar5);
  }
  else {
LAB_00105f40:
    uVar8 = 0;
  }
LAB_00105f61:
  return (int)uVar8;
}

Assistant:

int read_line_alloc(void* in, DataSourceType in_type, SXML_CHAR** line, int* sz_line, int i0, SXML_CHAR from, SXML_CHAR to, int keep_fromto, SXML_CHAR interest, int* interest_count)
{
	int init_sz = 0;
	SXML_CHAR ch, *pt;
	int c;
	int n, ret;
	int (*mgetc)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_bgetc : (int(*)(void*))sx_fgetc);
	int (*meos)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_beob : (int(*)(void*))sx_feof);
	
	if (in == NULL || line == NULL)
		return 0;
	
	if (to == NULC)
		to = C2SX('\n');
	/* Search for character 'from' */
	if (interest_count != NULL)
		*interest_count = 0;
	for (;;) {
		/* Reaching EOF before 'to' char is not an error but should trigger 'line' alloc and init to '' */
		c = mgetc(in);
		ch = (SXML_CHAR)c;
		if (c == EOF)
			break;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		/* If 'from' is '\0', we stop here */
		if (ch == from || from == NULC)
			break;
	}
	
	if (sz_line == NULL)
		sz_line = &init_sz;
	
	if (*line == NULL || *sz_line == 0) {
		if (*sz_line == 0)
			*sz_line = MEM_INCR_RLA;
		*line = __malloc(*sz_line*sizeof(SXML_CHAR));
		if (*line == NULL)
			return 0;
	}
	if (i0 < 0)
		i0 = 0;
	if (i0 >= *sz_line)
		return 0;
	
	n = i0;
	if (c == CEOF) { /* EOF reached before 'to' char => return the empty string */
		(*line)[n] = NULC;
		return meos(in) ? n : 0; /* Error if not EOF */
	}
	if (ch != from || keep_fromto) {
		(*line)[n++] = ch;
		if (n >= *sz_line) {
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				return 0;
			} else
				*line = pt;
		}
	}
	(*line)[n] = NULC;
	ret = 0;
	for (;;) {
		if ((c = mgetc(in)) == CEOF) { /* EOF or error */
			(*line)[n] = NULC;
			ret = meos(in) ? n : 0;
			break;
		}
		ch = (SXML_CHAR)c;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		(*line)[n] = ch;
		if (ch != to || (keep_fromto && to != NULC && ch == to)) /* If we reached the 'to' character and we keep it, we still need to add the extra '\0' */
			n++;
		if (n >= *sz_line) { /* Too many characters for our line => realloc some more */
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				ret = 0;
				break;
			} else
				*line = pt;
		}
		(*line)[n] = NULC; /* If we reached the 'to' character and we want to strip it, 'n' hasn't changed and 'line[n]' (which is 'to') will be replaced by '\0' */
		if (ch == to) {
			ret = n;
			break;
		}
	}
	
#if 0 /* Automatic buffer resize is deactivated */
	/* Resize line to the exact size */
	pt = __realloc(*line, (n+1)*sizeof(SXML_CHAR));
	if (pt != NULL)
		*line = pt;
#endif
	
	return ret;
}